

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

void xmlParserCheckEOF(xmlParserCtxtPtr ctxt,xmlParserErrors code)

{
  xmlCharEncError xVar1;
  size_t sStack_38;
  xmlCharEncError ret;
  size_t sizeOut;
  size_t curBase;
  xmlParserInputBufferPtr buf;
  xmlParserInputPtr in;
  xmlParserCtxtPtr pxStack_10;
  xmlParserErrors code_local;
  xmlParserCtxtPtr ctxt_local;
  
  buf = (xmlParserInputBufferPtr)ctxt->input;
  if (ctxt->errNo == 0) {
    in._4_4_ = code;
    pxStack_10 = ctxt;
    if (((xmlParserInputPtr)buf)->cur < ((xmlParserInputPtr)buf)->end) {
      xmlFatalErr(ctxt,code,(char *)0x0);
    }
    else {
      curBase = (size_t)((xmlParserInputPtr)buf)->buf;
      if (((xmlParserInputBufferPtr)curBase != (xmlParserInputBufferPtr)0x0) &&
         (((xmlParserInputBufferPtr)curBase)->encoder != (xmlCharEncodingHandlerPtr)0x0)) {
        sizeOut = (long)((xmlParserInputPtr)buf)->cur - (long)((xmlParserInputPtr)buf)->base;
        sStack_38 = 0x40;
        xVar1 = xmlCharEncInput((xmlParserInputBufferPtr)curBase,&stack0xffffffffffffffc8,1);
        xmlBufUpdateInput(*(xmlBufPtr *)(curBase + 0x20),(xmlParserInputPtr)buf,sizeOut);
        if (xVar1 == XML_ENC_ERR_SUCCESS) {
          if (buf->buffer < buf->raw) {
            xmlFatalErr(pxStack_10,XML_ERR_INTERNAL_ERROR,"expected EOF");
          }
        }
        else {
          xmlCtxtErrIO(pxStack_10,*(int *)(curBase + 0x34),(char *)0x0);
        }
      }
    }
  }
  return;
}

Assistant:

void
xmlParserCheckEOF(xmlParserCtxtPtr ctxt, xmlParserErrors code) {
    xmlParserInputPtr in = ctxt->input;
    xmlParserInputBufferPtr buf;

    if (ctxt->errNo != XML_ERR_OK)
        return;

    if (in->cur < in->end) {
        xmlFatalErr(ctxt, code, NULL);
        return;
    }

    buf = in->buf;
    if ((buf != NULL) && (buf->encoder != NULL)) {
        size_t curBase = in->cur - in->base;
        size_t sizeOut = 64;
        xmlCharEncError ret;

        /*
         * Check for truncated multi-byte sequence
         */
        ret = xmlCharEncInput(buf, &sizeOut, /* flush */ 1);
        xmlBufUpdateInput(buf->buffer, in, curBase);
        if (ret != XML_ENC_ERR_SUCCESS) {
            xmlCtxtErrIO(ctxt, buf->error, NULL);
            return;
        }

        /* Shouldn't happen */
        if (in->cur < in->end)
            xmlFatalErr(ctxt, XML_ERR_INTERNAL_ERROR, "expected EOF");
    }
}